

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

process_id lsvm::system::new_process(block *b)

{
  block *b_00;
  message_frame *pmVar1;
  process *p;
  size_t in_stack_ffffffffffffffe8;
  
  b_00 = (block *)memory::allocate(in_stack_ffffffffffffffe8);
  processes_count = processes_count + 1;
  b_00->v_args = processes_count;
  *(block ***)b_00 = &processes;
  b_00->op = (bytecode_op_t *)processes;
  pmVar1 = object::new_message_frame(b_00);
  *(message_frame **)(b_00 + 1) = pmVar1;
  b_00->v_copy = 0;
  processes = b_00;
  return b_00->v_args;
}

Assistant:

process_id new_process(block* b){
    process* p = (process*)lsvm::memory::allocate(sizeof(process));
    p->id = ++processes_count;
    p->prev = &processes;
    p->next = processes;
    p->mf = lsvm::object::new_message_frame(b);
    p->status = RUNNING;
    processes = p;
    return p->id;
}